

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrinput.cc
# Opt level: O0

void __thiscall ExrInput::~ExrInput(ExrInput *this)

{
  ExrInput *in_RDI;
  
  ~ExrInput(in_RDI);
  operator_delete(in_RDI,0x3b8);
  return;
}

Assistant:

~ExrInput() {
        // FreeEXRVersion(&version); // No need to call, no such function
        if (image.width != 0 && image.height != 0) {
            FreeEXRImage(&image);
        }
        FreeEXRHeader(&header);
        FreeEXRErrorMessage(err);
    }